

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O1

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  uint32_t uVar1;
  MDD MVar2;
  rel_t prVar3;
  int *piVar4;
  char *__s;
  uint uVar5;
  double dVar6;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *mtbdd;
  undefined1 *puVar7;
  undefined8 uVar8;
  undefined8 lddmc;
  FILE *pFVar9;
  size_t sVar10;
  void *__ptr;
  size_t sVar11;
  MTBDD MVar12;
  rel_t prVar13;
  undefined1 *puVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong __n;
  undefined1 *puVar22;
  int *piStack_e0;
  undefined1 auStack_d8 [16];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_c8;
  undefined1 *puStack_c0;
  FILE *pFStack_b8;
  MTBDD MStack_b0;
  FILE *pFStack_a8;
  rel_t prStack_a0;
  undefined1 auStack_98 [20];
  int iStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 auStack_78 [24];
  FILE *pFStack_60;
  undefined8 uStack_58;
  MDD MStack_50;
  FILE *pFStack_38;
  
  puVar22 = auStack_d8;
  puVar14 = auStack_d8;
  piStack_e0 = (int *)0x10546b;
  pFVar9 = fopen(model_filename,"rb");
  if (pFVar9 == (FILE *)0x0) goto LAB_00106177;
  piStack_e0 = (int *)0x105490;
  sVar10 = fread(&vector_size,4,1,pFVar9);
  puVar22 = auStack_d8;
  if (sVar10 != 1) goto LAB_0010617c;
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x1054af;
    puts("Loading initial state.");
  }
  auStack_78._0_8_ = set_load_WRAP;
  auStack_78._8_8_ = (_Worker *)0x1;
  piStack_e0 = (int *)0x1054d1;
  auStack_78._16_8_ = pFVar9;
  lace_run_task((Task *)auStack_78);
  pFStack_b8 = (FILE *)auStack_78._16_8_;
  piStack_e0 = (int *)0x1054f5;
  sVar10 = fread(&next_count,4,1,pFVar9);
  puVar22 = auStack_d8;
  if (sVar10 != 1) goto LAB_00106181;
  piStack_e0 = (int *)0x10550f;
  next = (rel_t *)malloc((long)next_count << 3);
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x10552b;
    puts("Loading transition relations.");
  }
  if (0 < next_count) {
    lVar17 = 0;
    do {
      auStack_78._0_8_ = rel_load_proj_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      piStack_e0 = (int *)0x105556;
      auStack_78._16_8_ = pFVar9;
      lace_run_task((Task *)auStack_78);
      next[lVar17] = (rel_t)auStack_78._16_8_;
      lVar17 = lVar17 + 1;
    } while (lVar17 < next_count);
  }
  if (0 < next_count) {
    lVar17 = 0;
    do {
      pFStack_60 = (FILE *)next[lVar17];
      auStack_78._0_8_ = rel_load_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      piStack_e0 = (int *)0x1055b2;
      auStack_78._16_8_ = pFVar9;
      lace_run_task((Task *)auStack_78);
      lVar17 = lVar17 + 1;
    } while (lVar17 < next_count);
  }
  iStack_84 = 0;
  piStack_e0 = (int *)0x1055dd;
  sVar10 = fread(&iStack_84,4,1,pFVar9);
  if (sVar10 != 1) goto LAB_00106186;
  puVar22 = auStack_d8;
  if (iStack_84 == 0) goto LAB_0010618b;
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x105606;
    puts("Loading reachable states.");
  }
  auStack_78._0_8_ = set_load_WRAP;
  auStack_78._8_8_ = (_Worker *)0x1;
  piStack_e0 = (int *)0x105621;
  auStack_78._16_8_ = pFVar9;
  lace_run_task((Task *)auStack_78);
  pFStack_a8 = (FILE *)auStack_78._16_8_;
  uStack_80 = 0;
  piStack_e0 = (int *)0x105648;
  sVar10 = fread(&uStack_80,4,1,pFVar9);
  if (sVar10 != 1) {
    uStack_80 = 0;
  }
  uVar21 = (ulong)uStack_80;
  lVar17 = -(uVar21 * 8 + 0xf & 0xfffffffffffffff0);
  puVar22 = auStack_d8 + lVar17;
  auStack_d8._8_8_ = auStack_d8;
  puStack_c0 = puVar22;
  if (0 < (int)uStack_80) {
    uVar20 = 0;
    auStack_d8._8_8_ = auStack_d8;
    do {
      *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x10569a;
      sVar10 = fread(auStack_78,4,1,pFVar9);
      if (sVar10 != 1) {
LAB_0010616d:
        *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x106172;
        run_CALL_cold_4();
        goto LAB_00106172;
      }
      __n = auStack_78._0_8_ & 0xffffffff;
      uVar15 = auStack_78._0_4_ + 1;
      *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x1056b1;
      __ptr = malloc((ulong)uVar15);
      *(void **)(puStack_c0 + uVar20 * 8) = __ptr;
      *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x1056d2;
      sVar10 = fread(__ptr,1,__n,pFVar9);
      if (sVar10 != __n) {
        *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x10616d;
        run_CALL_cold_5();
        goto LAB_0010616d;
      }
      *(undefined1 *)((long)__ptr + __n) = 0;
      uVar20 = uVar20 + 1;
    } while (uVar21 != uVar20);
  }
  *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x1056f0;
  fclose(pFVar9);
  *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x105705;
  printf("Read file %s.\n");
  if (verbose != '\0') {
    *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x10572c;
    printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
           (ulong)(uint)next_count);
    *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x105738;
    puts("LDD nodes:");
    MVar2 = *(MDD *)pFStack_b8;
    *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x105747;
    lddmc_nodecount(MVar2);
    *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x105758;
    printf("Initial states: %zu LDD nodes\n");
    if (0 < next_count) {
      uVar21 = 0;
      do {
        MVar2 = next[uVar21]->dd;
        *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x10577e;
        sVar11 = lddmc_nodecount(MVar2);
        *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x10578e;
        printf("Transition %d: %zu LDD nodes\n",uVar21 & 0xffffffff,sVar11);
        uVar21 = uVar21 + 1;
      } while ((long)uVar21 < (long)next_count);
    }
  }
  if (verbose == '\x01') {
    *(undefined8 *)(auStack_d8 + lVar17 + -8) = 0x1057b2;
    puts("Preparing conversion to BDD...");
  }
  prVar13 = (rel_t)(puVar22 + -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    prVar13[-1].w_proj = (int *)0x1057df;
    memset(prVar13,0,(ulong)(uint)vector_size << 2);
  }
  auStack_78._16_8_ = *(undefined8 *)pFStack_a8;
  auStack_78._0_8_ = compute_highest_WRAP;
  auStack_78._8_8_ = (_Worker *)0x1;
  pFStack_60 = (FILE *)prVar13;
  prVar13[-1].w_proj = (int *)0x10580c;
  lace_run_task((Task *)auStack_78);
  uStack_7c = 0;
  if (0 < next_count) {
    lVar17 = 0;
    do {
      auStack_78._16_8_ = next[lVar17]->dd;
      pFStack_60 = (FILE *)next[lVar17]->meta;
      auStack_78._0_8_ = compute_highest_action_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      uStack_58 = &uStack_7c;
      prVar13[-1].w_proj = (int *)0x105858;
      lace_run_task((Task *)auStack_78);
      lVar17 = lVar17 + 1;
    } while (lVar17 < next_count);
  }
  puVar22 = (undefined1 *)
            ((long)prVar13 - ((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    uVar21 = 0;
    do {
      *(undefined4 *)(puVar22 + uVar21 * 4) = 0;
      uVar15 = *(uint *)((long)&prVar13->dd + uVar21 * 4);
      if (uVar15 != 0) {
        uVar5 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        iVar16 = (uVar5 ^ 0x1f) - 0x20;
        do {
          uVar15 = uVar15 >> 1;
          iVar16 = iVar16 + 1;
        } while (iVar16 != 0);
        *(uint *)(puVar22 + uVar21 * 4) = (*(int *)(puVar22 + uVar21 * 4) - (uVar5 ^ 0x1f)) + 0x20;
        *(uint *)((long)&prVar13->dd + uVar21 * 4) = uVar15;
      }
      *(uint *)(puVar22 + uVar21 * 4) =
           *(int *)(puVar22 + uVar21 * 4) + (uint)(*(int *)(puVar22 + uVar21 * 4) == 0);
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)vector_size);
  }
  actionbits = 0;
  if (uStack_7c != 0) {
    uVar15 = 0x1f;
    if (uStack_7c != 0) {
      for (; uStack_7c >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    actionbits = 0x20 - (uVar15 ^ 0x1f);
    iVar16 = (uVar15 ^ 0x1f) - 0x20;
    do {
      uStack_7c = uStack_7c >> 1;
      iVar16 = iVar16 + 1;
    } while (iVar16 != 0);
  }
  if ((actionbits == 0) && ((has_actions & 1) != 0)) {
    actionbits = 1;
  }
  if (verbose == '\x01') {
    *(undefined8 *)(puVar22 + -8) = 0x10592f;
    printf("Bits per level: ");
    if (0 < vector_size) {
      lVar17 = 0;
      do {
        if (lVar17 != 0) {
          *(undefined8 *)(puVar22 + -8) = 0x105958;
          printf(", ");
        }
        uVar15 = *(uint *)(puVar22 + lVar17 * 4);
        *(undefined8 *)(puVar22 + -8) = 0x105966;
        printf("%d",(ulong)uVar15);
        lVar17 = lVar17 + 1;
      } while (lVar17 < vector_size);
    }
    *(undefined8 *)(puVar22 + -8) = 0x10597f;
    putchar(10);
    *(undefined8 *)(puVar22 + -8) = 0x105993;
    printf("Action bits: %d.\n");
  }
  prVar13 = (rel_t)0x1;
  if (0 < vector_size) {
    iVar16 = 0;
    iVar19 = -1;
    do {
      uVar1 = *(uint32_t *)(puVar22 + (long)(vector_size + iVar19) * 4);
      *(undefined8 *)(puVar22 + -8) = 0x1059be;
      prVar13 = (rel_t)lddmc_makenode(uVar1,(MDD)prVar13,0);
      iVar16 = iVar16 + 1;
      iVar19 = iVar19 + -1;
    } while (iVar16 < vector_size);
  }
  *(undefined8 *)(puVar22 + -8) = 0x1059d8;
  lddmc_ref((MDD)prVar13);
  if ((long)vector_size < 1) {
    iVar16 = 0;
  }
  else {
    lVar17 = 0;
    iVar16 = 0;
    do {
      iVar16 = iVar16 + *(int *)(puVar22 + lVar17 * 4);
      lVar17 = lVar17 + 1;
    } while (vector_size != lVar17);
  }
  MStack_b0 = 0x8000000000000000;
  if (0 < iVar16) {
    uVar1 = iVar16 * 2;
    iVar19 = iVar16;
    do {
      MVar12 = MStack_b0;
      uVar1 = uVar1 - 2;
      if (MStack_b0 == 0) {
        MStack_b0 = 0;
      }
      else {
        *(undefined8 *)(puVar22 + -8) = 0x105a2e;
        MStack_b0 = _mtbdd_makenode(uVar1,0,MVar12);
      }
      iVar19 = iVar19 + -1;
    } while (iVar19 != 0);
  }
  *(undefined8 *)(puVar22 + -8) = 0x105a4e;
  mtbdd_protect(&MStack_b0);
  if (verbose != '\0') {
    *(undefined8 *)(puVar22 + -8) = 0x105a63;
    puts("Converting to BDD...");
  }
  prStack_a0 = prVar13;
  *(undefined8 *)(puVar22 + -8) = 0x105a7d;
  pFVar9 = fopen(bdd_filename,"w");
  pFStack_38 = pFVar9;
  if (pFVar9 != (FILE *)0x0) {
    *(undefined8 *)(puVar22 + -8) = 0x105aa7;
    fwrite(&vector_size,4,1,pFVar9);
    *(undefined8 *)(puVar22 + -8) = 0x105abe;
    fwrite(puVar22,4,(long)vector_size,pFVar9);
    *(undefined8 *)(puVar22 + -8) = 0x105ad7;
    fwrite(&actionbits,4,1,pFVar9);
    pFVar9 = pFStack_b8;
    auStack_78._16_8_ = *(undefined8 *)pFStack_b8;
    auStack_78._0_8_ = bdd_from_ldd_WRAP;
    auStack_78._8_8_ = (_Worker *)0x1;
    pFStack_60 = (FILE *)prStack_a0;
    uStack_58 = (uint *)((ulong)uStack_58 & 0xffffffff00000000);
    *(undefined8 *)(puVar22 + -8) = 0x105b17;
    lace_run_task((Task *)auStack_78);
    p_Stack_c8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_78._16_8_;
    auStack_78._0_8_ = mtbdd_satcount_WRAP;
    auStack_78._8_8_ = (_Worker *)0x1;
    pFStack_60 = (FILE *)(long)iVar16;
    *(undefined8 *)(puVar22 + -8) = 0x105b47;
    lace_run_task((Task *)auStack_78);
    uVar21 = (ulong)(double)auStack_78._16_8_;
    dVar6 = (double)auStack_78._16_8_ - 9.223372036854776e+18;
    auStack_78._16_8_ = *(undefined8 *)pFVar9;
    auStack_78._0_8_ = lddmc_satcount_cached_WRAP;
    auStack_78._8_8_ = (_Worker *)0x1;
    *(undefined8 *)(puVar22 + -8) = 0x105b8e;
    lace_run_task((Task *)auStack_78);
    mtbdd = p_Stack_c8;
    if (((long)uVar21 >> 0x3f & (long)dVar6 | uVar21) ==
        ((long)(double)auStack_78._16_8_ >> 0x3f &
         (long)((double)auStack_78._16_8_ - 9.223372036854776e+18) | (long)(double)auStack_78._16_8_
        )) {
      *(undefined8 *)(puVar22 + -8) = 0x105bcc;
      mtbdd_refs_push((MTBDD)mtbdd);
      pFVar9 = pFStack_38;
      auStack_98._0_4_ = 0xffffffff;
      *(undefined8 *)(puVar22 + -8) = 0x105bf4;
      fwrite(auStack_98,4,1,pFVar9);
      auStack_78._0_8_ = mtbdd_writer_tobinary_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      auStack_78._16_8_ = pFVar9;
      uStack_58._0_1_ = '\x01';
      uStack_58._1_1_ = '\0';
      uStack_58._2_1_ = '\0';
      uStack_58._3_1_ = '\0';
      pFStack_60 = (FILE *)&p_Stack_c8;
      *(undefined8 *)(puVar22 + -8) = 0x105c1e;
      lace_run_task((Task *)auStack_78);
      prVar13 = prStack_a0;
      pFVar9 = pFStack_a8;
      auStack_78._16_8_ = *(undefined8 *)pFStack_a8;
      auStack_78._0_8_ = bdd_from_ldd_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      pFStack_60 = (FILE *)prStack_a0;
      uStack_58 = (uint *)((ulong)uStack_58._4_4_ << 0x20);
      *(undefined8 *)(puVar22 + -8) = 0x105c5a;
      lace_run_task((Task *)auStack_78);
      auStack_98._0_8_ = auStack_78._16_8_;
      auStack_78._0_8_ = mtbdd_satcount_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      pFStack_60 = (FILE *)(long)iVar16;
      *(undefined8 *)(puVar22 + -8) = 0x105c84;
      lace_run_task((Task *)auStack_78);
      uVar21 = (ulong)(double)auStack_78._16_8_;
      dVar6 = (double)auStack_78._16_8_ - 9.223372036854776e+18;
      auStack_78._16_8_ = *(undefined8 *)pFVar9;
      auStack_78._0_8_ = lddmc_satcount_cached_WRAP;
      auStack_78._8_8_ = (_Worker *)0x1;
      *(undefined8 *)(puVar22 + -8) = 0x105ccf;
      lace_run_task((Task *)auStack_78);
      uVar8 = auStack_98._0_8_;
      if (((long)uVar21 >> 0x3f & (long)dVar6 | uVar21) !=
          ((long)(double)auStack_78._16_8_ >> 0x3f &
           (long)((double)auStack_78._16_8_ - 9.223372036854776e+18) |
          (long)(double)auStack_78._16_8_)) {
        *(code **)(puVar22 + -8) = main;
        __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                      ,0x2b2,"void run_WORK(WorkerP *, Task *)");
      }
      *(undefined8 *)(puVar22 + -8) = 0x105d0c;
      mtbdd_refs_push(uVar8);
      if (verbose == '\x01') {
        auStack_78._0_8_ = p_Stack_c8;
        *(undefined8 *)(puVar22 + -8) = 0x105d2c;
        sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_78,1);
        *(undefined8 *)(puVar22 + -8) = 0x105d3d;
        printf("Initial states: %zu BDD nodes\n",sVar11);
        auStack_78._0_8_ = auStack_98._0_8_;
        *(undefined8 *)(puVar22 + -8) = 0x105d55;
        sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_78,1);
        *(undefined8 *)(puVar22 + -8) = 0x105d66;
        printf("Reachable states: %zu BDD nodes\n",sVar11);
      }
      pFVar9 = pFStack_38;
      *(undefined8 *)(puVar22 + -8) = 0x105d80;
      fwrite(&next_count,4,1,pFVar9);
      pFVar9 = pFStack_38;
      if (0 < next_count) {
        lVar17 = 0;
        do {
          prVar3 = next[lVar17];
          *(undefined8 *)(puVar22 + -8) = 0x105db4;
          fwrite(&prVar3->r_k,4,1,pFVar9);
          prVar3 = next[lVar17];
          *(undefined8 *)(puVar22 + -8) = 0x105dd5;
          fwrite(&prVar3->w_k,4,1,pFVar9);
          piVar4 = next[lVar17]->r_proj;
          iVar16 = next[lVar17]->r_k;
          *(undefined8 *)(puVar22 + -8) = 0x105df5;
          fwrite(piVar4,4,(long)iVar16,pFVar9);
          piVar4 = next[lVar17]->w_proj;
          iVar16 = next[lVar17]->w_k;
          *(undefined8 *)(puVar22 + -8) = 0x105e15;
          fwrite(piVar4,4,(long)iVar16,pFVar9);
          lVar17 = lVar17 + 1;
        } while (lVar17 < next_count);
      }
      if (0 < next_count) {
        uVar21 = 0;
        do {
          auStack_78._16_8_ = next[uVar21]->dd;
          MStack_50 = next[uVar21]->meta;
          auStack_78._0_8_ = bdd_from_ldd_rel_WRAP;
          auStack_78._8_8_ = (_Worker *)0x1;
          uStack_58 = (uint *)((ulong)uStack_58 & 0xffffffff00000000);
          pFStack_60 = (FILE *)prVar13;
          *(undefined8 *)(puVar22 + -8) = 0x105e83;
          lace_run_task((Task *)auStack_78);
          uVar8 = auStack_78._16_8_;
          auStack_98._8_8_ = auStack_78._16_8_;
          *(undefined8 *)(puVar22 + -8) = 0x105e93;
          mtbdd_refs_push(uVar8);
          auStack_78._0_8_ = mtbdd_writer_tobinary_WRAP;
          auStack_78._8_8_ = (_Worker *)0x1;
          auStack_78._16_8_ = pFStack_38;
          uStack_58 = (uint *)CONCAT44(uStack_58._4_4_,1);
          pFStack_60 = (FILE *)(auStack_98 + 8);
          *(undefined8 *)(puVar22 + -8) = 0x105ec1;
          lace_run_task((Task *)auStack_78);
          if (verbose == '\x01') {
            auStack_78._0_8_ = auStack_98._8_8_;
            *(undefined8 *)(puVar22 + -8) = 0x105ee2;
            sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_78,1);
            *(undefined8 *)(puVar22 + -8) = 0x105ef6;
            printf("Transition %d: %zu BDD nodes\n",uVar21 & 0xffffffff,sVar11);
          }
          if (check_results == '\x01') {
            MVar2 = next[uVar21]->meta;
            *(undefined8 *)(puVar22 + -8) = 0x105f1f;
            MVar12 = meta_to_bdd(MVar2,(MDD)prVar13,0);
            *(undefined8 *)(puVar22 + -8) = 0x105f2d;
            mtbdd_refs_push(MVar12);
            auStack_78._0_8_ = sylvan_relnext_WRAP;
            auStack_78._8_8_ = (_Worker *)0x1;
            auStack_78._16_8_ = auStack_98._0_8_;
            pFStack_60 = (FILE *)auStack_98._8_8_;
            MStack_50 = MStack_50 & 0xffffffff00000000;
            uStack_58 = (uint *)MVar12;
            *(undefined8 *)(puVar22 + -8) = 0x105f67;
            lace_run_task((Task *)auStack_78);
            uVar8 = auStack_78._16_8_;
            *(undefined8 *)(puVar22 + -8) = 0x105f73;
            mtbdd_refs_push(uVar8);
            auStack_78._16_8_ = *(undefined8 *)pFStack_a8;
            pFStack_60 = (FILE *)next[uVar21]->dd;
            uStack_58 = (uint *)next[uVar21]->meta;
            auStack_78._0_8_ = lddmc_relprod_WRAP;
            auStack_78._8_8_ = (_Worker *)0x1;
            *(undefined8 *)(puVar22 + -8) = 0x105fb0;
            lace_run_task((Task *)auStack_78);
            lddmc = auStack_78._16_8_;
            *(undefined8 *)(puVar22 + -8) = 0x105fbc;
            lddmc_refs_push(lddmc);
            auStack_78._0_8_ = bdd_from_ldd_WRAP;
            auStack_78._8_8_ = (_Worker *)0x1;
            uStack_58 = (uint *)((ulong)uStack_58 & 0xffffffff00000000);
            auStack_78._16_8_ = lddmc;
            pFStack_60 = (FILE *)prVar13;
            *(undefined8 *)(puVar22 + -8) = 0x105fe7;
            lace_run_task((Task *)auStack_78);
            if (uVar8 != auStack_78._16_8_) goto LAB_00106172;
            *(undefined8 *)(puVar22 + -8) = 0x105ffb;
            lddmc_refs_pop(1);
            *(undefined8 *)(puVar22 + -8) = 0x106005;
            mtbdd_refs_pop(2);
            prVar13 = prStack_a0;
          }
          *(undefined8 *)(puVar22 + -8) = 0x106024;
          mtbdd_refs_pop(1);
          uVar21 = uVar21 + 1;
        } while ((long)uVar21 < (long)next_count);
      }
      pFVar9 = pFStack_38;
      if (no_reachable != '\0') {
        iStack_84 = 0;
      }
      *(undefined8 *)(puVar22 + -8) = 0x106061;
      fwrite(&iStack_84,4,1,pFVar9);
      pFVar9 = pFStack_38;
      if (iStack_84 != 0) {
        auStack_98._8_4_ = 0xffffffff;
        *(undefined8 *)(puVar22 + -8) = 0x106089;
        fwrite(auStack_98 + 8,4,1,pFVar9);
        auStack_78._0_8_ = mtbdd_writer_tobinary_WRAP;
        auStack_78._8_8_ = (_Worker *)0x1;
        auStack_78._16_8_ = pFVar9;
        pFStack_60 = (FILE *)auStack_98;
        uStack_58 = (uint *)CONCAT44(uStack_58._4_4_,1);
        *(undefined8 *)(puVar22 + -8) = 0x1060ba;
        lace_run_task((Task *)auStack_78);
      }
      *(undefined8 *)(puVar22 + -8) = 0x1060c4;
      mtbdd_refs_pop(1);
      pFVar9 = pFStack_38;
      *(undefined8 *)(puVar22 + -8) = 0x1060de;
      fwrite(&uStack_80,4,1,pFVar9);
      pFVar9 = pFStack_38;
      puVar7 = puStack_c0;
      lVar17 = (long)(int)uStack_80;
      if (0 < lVar17) {
        lVar18 = 0;
        do {
          __s = *(char **)(puVar7 + lVar18 * 8);
          *(undefined8 *)(puVar22 + -8) = 0x106100;
          sVar10 = strlen(__s);
          auStack_78._0_4_ = (int)sVar10;
          *(undefined8 *)(puVar22 + -8) = 0x106119;
          fwrite(auStack_78,4,1,pFVar9);
          uVar21 = auStack_78._0_8_ & 0xffffffff;
          *(undefined8 *)(puVar22 + -8) = 0x10612c;
          fwrite(__s,1,uVar21,pFVar9);
          lVar18 = lVar18 + 1;
        } while (lVar17 != lVar18);
      }
      pFVar9 = pFStack_38;
      *(undefined8 *)(puVar22 + -8) = 0x10613d;
      fclose(pFVar9);
      *(undefined8 *)(puVar22 + -8) = 0x106152;
      printf("Written file %s.\n",bdd_filename);
      return;
    }
    goto LAB_00106195;
  }
  goto LAB_00106190;
LAB_00106172:
  *(undefined8 *)(puVar22 + -8) = 0x106177;
  run_CALL_cold_6();
LAB_00106177:
  *(undefined8 *)(puVar22 + -8) = 0x10617c;
  run_CALL_cold_9();
LAB_0010617c:
  *(undefined8 *)(puVar22 + -8) = 0x106181;
  run_CALL_cold_1();
LAB_00106181:
  puVar14 = puVar22;
  *(undefined8 *)(puVar14 + -8) = 0x106186;
  run_CALL_cold_2();
LAB_00106186:
  *(undefined8 *)(puVar14 + -8) = 0x10618b;
  run_CALL_cold_3();
  puVar22 = puVar14;
LAB_0010618b:
  *(undefined8 *)(puVar22 + -8) = 0x106190;
  run_CALL_cold_8();
LAB_00106190:
  *(undefined8 *)(puVar22 + -8) = 0x106195;
  run_CALL_cold_7();
LAB_00106195:
  *(undefined8 *)(puVar22 + -8) = 0x1061b4;
  __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                ,0x2a8,"void run_WORK(WorkerP *, Task *)");
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}